

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void errline(int n,int k,FILE *err)

{
  size_t sVar1;
  char *__format;
  char **ppcVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  fputs(*g_argv,(FILE *)err);
  ppcVar2 = g_argv;
  sVar1 = strlen(*g_argv);
  iVar4 = (int)sVar1;
  uVar5 = 1;
  if (1 < n) {
    uVar5 = n;
  }
  lVar3 = 1;
  do {
    if (n <= lVar3) {
LAB_001090d4:
      for (lVar3 = (ulong)uVar5 << 3; *(long *)((long)ppcVar2 + lVar3) != 0; lVar3 = lVar3 + 8) {
        fprintf((FILE *)err," %s");
        ppcVar2 = g_argv;
      }
      uVar5 = iVar4 + 1 + k;
      if ((int)uVar5 < 0x14) {
        __format = "\n%*s^-- here\n";
      }
      else {
        uVar5 = uVar5 - 7;
        __format = "\n%*shere --^\n";
      }
      fprintf((FILE *)err,__format,(ulong)uVar5,"");
      return;
    }
    if (ppcVar2[lVar3] == (char *)0x0) {
      uVar5 = (uint)lVar3;
      goto LAB_001090d4;
    }
    fprintf((FILE *)err," %s");
    ppcVar2 = g_argv;
    sVar1 = strlen(g_argv[lVar3]);
    iVar4 = iVar4 + 1 + (int)sVar1;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static void errline(int n, int k, FILE *err)
{
  int spcnt, i;
  if( g_argv[0] ) fprintf(err,"%s",g_argv[0]);
  spcnt = lemonStrlen(g_argv[0]) + 1;
  for(i=1; i<n && g_argv[i]; i++){
    fprintf(err," %s",g_argv[i]);
    spcnt += lemonStrlen(g_argv[i])+1;
  }
  spcnt += k;
  for(; g_argv[i]; i++) fprintf(err," %s",g_argv[i]);
  if( spcnt<20 ){
    fprintf(err,"\n%*s^-- here\n",spcnt,"");
  }else{
    fprintf(err,"\n%*shere --^\n",spcnt-7,"");
  }
}